

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O2

bool __thiscall Diligent::IsDXILBytecode(Diligent *this,void *pBytecode,size_t Size)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  char (*in_stack_ffffffffffffffc8) [13];
  char local_30 [4];
  uint local_2c;
  string _msg;
  
  if ((0x1f < (long)pBytecode) && (*(int *)this == 0x43425844)) {
    local_2c = (uint)*(ushort *)(this + 0x14);
    if (local_2c == 1) {
      uVar2 = (ulong)*(uint *)(this + 0x1c);
      if (this + uVar2 * 4 + 0x20 <= (Diligent *)((long)pBytecode + (long)this)) {
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          bVar3 = (byte)Size;
          if (uVar2 == uVar4) goto LAB_00281079;
          if ((Diligent *)((long)pBytecode + (long)this) <
              this + (ulong)*(uint *)(this + uVar4 * 4 + 0x20) + 8) {
            bVar3 = 0;
            goto LAB_00281079;
          }
          Size = (size_t)(this + *(uint *)(this + uVar4 * 4 + 0x20));
          uVar1 = uVar4 + 1;
        } while (*(int *)Size != 0x4c495844);
        bVar3 = 1;
LAB_00281079:
        return (bool)(uVar4 < uVar2 & bVar3);
      }
    }
    else {
      local_30[0] = '\x01';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      FormatString<char[64],unsigned_int,char[8],unsigned_int,char[13]>
                (&_msg,(Diligent *)"Unable to parse DXIL container: the container major version is "
                 ,(char (*) [64])&local_2c,(uint *)0x5cece2,(char (*) [8])local_30,(uint *)0x5da7e2,
                 in_stack_ffffffffffffffc8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  return false;
}

Assistant:

bool IsDXILBytecode(const void* pBytecode, size_t Size)
{
    const uint8_t* data_begin = static_cast<const uint8_t*>(pBytecode);
    const uint8_t* data_end   = data_begin + Size;
    const uint8_t* ptr        = data_begin;

    if (ptr + sizeof(hlsl::DxilContainerHeader) > data_end)
    {
        // No space for the container header
        return false;
    }

    // A DXIL container is composed of a header, a sequence of part lengths, and a sequence of parts.
    // https://github.com/microsoft/DirectXShaderCompiler/blob/master/docs/DXIL.rst#dxil-container-format
    const hlsl::DxilContainerHeader& ContainerHeader = *reinterpret_cast<const hlsl::DxilContainerHeader*>(ptr);
    if (ContainerHeader.HeaderFourCC != hlsl::DFCC_Container)
    {
        // Incorrect FourCC
        return false;
    }

    if (ContainerHeader.Version.Major != hlsl::DxilContainerVersionMajor)
    {
        LOG_WARNING_MESSAGE("Unable to parse DXIL container: the container major version is ", Uint32{ContainerHeader.Version.Major},
                            " while ", Uint32{hlsl::DxilContainerVersionMajor}, " is expected");
        return false;
    }

    // The header is followed by uint32_t PartOffset[PartCount];
    // The offset is to a DxilPartHeader.
    ptr += sizeof(hlsl::DxilContainerHeader);
    if (ptr + sizeof(uint32_t) * ContainerHeader.PartCount > data_end)
    {
        // No space for offsets
        return false;
    }

    const uint32_t* PartOffsets = reinterpret_cast<const uint32_t*>(ptr);
    for (uint32_t part = 0; part < ContainerHeader.PartCount; ++part)
    {
        const uint32_t Offset = PartOffsets[part];
        if (data_begin + Offset + sizeof(hlsl::DxilPartHeader) > data_end)
        {
            // No space for the part header
            return false;
        }

        const hlsl::DxilPartHeader& PartHeader = *reinterpret_cast<const hlsl::DxilPartHeader*>(data_begin + Offset);
        if (PartHeader.PartFourCC == hlsl::DFCC_DXIL)
        {
            // We found DXIL part
            return true;
        }
    }

    return false;
}